

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cpp
# Opt level: O2

bool doubleComma(char **p)

{
  char *pcVar1;
  bool bVar2;
  
  SkipBlanks(p);
  pcVar1 = *p;
  if ((*pcVar1 == ',') && (pcVar1[1] == ',')) {
    *p = pcVar1 + 2;
    bVar2 = true;
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool doubleComma(char* & p) {
	SkipBlanks(p);
	if (',' != p[0] || ',' != p[1]) return false;
	p += 2;
	return true;
}